

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

bool __thiscall
ON_ObjectArray<ON_BrepFace>::QuickSort
          (ON_ObjectArray<ON_BrepFace> *this,_func_int_ON_BrepFace_ptr_ON_BrepFace_ptr *compar)

{
  uint uVar1;
  ON_BrepFace *pOVar2;
  long lVar3;
  long lVar4;
  
  pOVar2 = (this->super_ON_ClassArray<ON_BrepFace>).m_a;
  if (pOVar2 != (ON_BrepFace *)0x0) {
    uVar1 = (this->super_ON_ClassArray<ON_BrepFace>).m_count;
    if (compar != (_func_int_ON_BrepFace_ptr_ON_BrepFace_ptr *)0x0 && 0 < (long)(int)uVar1) {
      if (uVar1 < 2) {
        return true;
      }
      ON_qsort(pOVar2,(long)(int)uVar1,0xd8,(_func_int_void_ptr_void_ptr *)compar);
      if ((this->super_ON_ClassArray<ON_BrepFace>).m_count < 1) {
        return true;
      }
      lVar4 = 0;
      lVar3 = 0;
      do {
        pOVar2 = (this->super_ON_ClassArray<ON_BrepFace>).m_a;
        (**(code **)(*(long *)((pOVar2->m_face_uuid).Data4 + lVar4 + -0x5c) + 0x28))
                  ((pOVar2->m_face_uuid).Data4 + lVar4 + -0x5c);
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0xd8;
      } while (lVar3 < (this->super_ON_ClassArray<ON_BrepFace>).m_count);
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ObjectArray<T>::QuickSort( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  // The "this->" in this->m_count and this->m_a 
  // are needed for gcc 4 to compile.
  if ( this->m_a && this->m_count > 0 && compar ) 
  {
    if ( this->m_count > 1 )
    {
      ON_qsort( this->m_a, this->m_count, sizeof(T), (int(*)(const void*,const void*))compar );

      // The MemoryRelocate step is required to synch userdata back pointers
      // so the user data destructor will work correctly.
      int i;
      for ( i = 0; i < this->m_count; i++ )
      {
        this->m_a[i].MemoryRelocate();
      }
    }
    rc = true;
  }
  return rc;
}